

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

size_t __thiscall efsw::String::find(String *this,char *s,size_t pos)

{
  size_t sVar1;
  String local_40;
  size_t local_20;
  size_t pos_local;
  char *s_local;
  String *this_local;
  
  local_20 = pos;
  pos_local = (size_t)s;
  s_local = (char *)this;
  String(&local_40,s);
  sVar1 = find(this,&local_40,local_20);
  ~String(&local_40);
  return sVar1;
}

Assistant:

std::size_t String::find( const char* s, std::size_t pos ) const {
	return find( String( s ), pos );
}